

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

deUint32 __thiscall vkt::pipeline::TestTexture::getSize(TestTexture *this)

{
  uint uVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TextureFormat *pTVar7;
  undefined1 local_98 [8];
  ConstPixelBufferAccess level;
  int layerNdx;
  int levelNdx;
  value_type_conflict1 local_40 [4];
  value_type_conflict1 local_30;
  deUint32 local_2c;
  undefined1 local_28 [4];
  deUint32 textureSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  TestTexture *this_local;
  
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  local_2c = 0;
  local_30 = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,&local_30);
  (*this->_vptr_TestTexture[8])(&layerNdx,this,0);
  pTVar7 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&layerNdx);
  local_40[0] = tcu::TextureFormat::getPixelSize(pTVar7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,local_40);
  level.m_data._4_4_ = 0;
  while( true ) {
    uVar1 = level.m_data._4_4_;
    iVar3 = (*this->_vptr_TestTexture[2])();
    dVar2 = local_2c;
    if (iVar3 <= (int)uVar1) break;
    level.m_data._0_4_ = 0;
    while( true ) {
      uVar1 = (uint)level.m_data;
      iVar3 = (*this->_vptr_TestTexture[4])();
      if (iVar3 <= (int)uVar1) break;
      (*this->_vptr_TestTexture[8])
                (local_98,this,(ulong)level.m_data._4_4_,(ulong)(uint)level.m_data);
      local_2c = getNextMultiple((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                                 local_2c);
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_98);
      iVar4 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_98);
      iVar5 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_98);
      pTVar7 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_98);
      iVar6 = tcu::TextureFormat::getPixelSize(pTVar7);
      local_2c = iVar3 * iVar4 * iVar5 * iVar6 + local_2c;
      level.m_data._0_4_ = (uint)level.m_data + 1;
    }
    level.m_data._4_4_ = level.m_data._4_4_ + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  return dVar2;
}

Assistant:

deUint32 TestTexture::getSize (void) const
{
	std::vector<deUint32>	offsetMultiples;
	deUint32				textureSize = 0;

	offsetMultiples.push_back(4);
	offsetMultiples.push_back(getLevel(0, 0).getFormat().getPixelSize());

	for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
	{
		for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
		{
			const tcu::ConstPixelBufferAccess level = getLevel(levelNdx, layerNdx);
			textureSize = getNextMultiple(offsetMultiples, textureSize);
			textureSize += level.getWidth() * level.getHeight() * level.getDepth() * level.getFormat().getPixelSize();
		}
	}

	return textureSize;
}